

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_2_5::TiledInputFile::numYTiles(TiledInputFile *this,int ly)

{
  ostream *poVar1;
  char *pcVar2;
  ArgExc *this_00;
  int in_ESI;
  long in_RDI;
  stringstream _iex_throw_s;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if ((-1 < in_ESI) && (in_ESI < *(int *)(*(long *)(in_RDI + 8) + 0xc0))) {
    return *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xd0) + (long)in_ESI * 4);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Error calling numYTiles() on image file \"");
  pcVar2 = IStream::fileName((IStream *)0x7e559b);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (Argument is not in valid range).");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

int
TiledInputFile::numYTiles (int ly) const
{
    if (ly < 0 || ly >= _data->numYLevels)
    {
        THROW (IEX_NAMESPACE::ArgExc, "Error calling numYTiles() on image "
			    "file \"" << _data->_streamData->is->fileName() << "\" "
			    "(Argument is not in valid range).");
    }
    
    return _data->numYTiles[ly];
}